

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

string * cmInstallGenerator::GetDestDirPath(string *__return_storage_ptr__,string *file)

{
  char *pcVar1;
  allocator<char> local_1a;
  undefined1 local_19;
  string *local_18;
  string *file_local;
  string *toDestDirPath;
  
  local_19 = 0;
  local_18 = file;
  file_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"$ENV{DESTDIR}",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
  if ((*pcVar1 != '/') &&
     (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_18), *pcVar1 != '$')) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_18);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallGenerator::GetDestDirPath(std::string const& file)
{
  // Construct the path of the file on disk after installation on
  // which tweaks may be performed.
  std::string toDestDirPath = "$ENV{DESTDIR}";
  if (file[0] != '/' && file[0] != '$') {
    toDestDirPath += "/";
  }
  toDestDirPath += file;
  return toDestDirPath;
}